

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O0

int Sbd_ProblemAddClauses(sat_solver *pSat,int nVars,int nStrs,int *pVars,Sbd_Str_t *pStr0)

{
  int iVar1;
  int iVar2;
  int local_68;
  int nMints;
  int pLits [6];
  int status;
  int n;
  int k;
  int m;
  int VarPar;
  int VarOut;
  Sbd_Str_t *pStr;
  Sbd_Str_t *pStr0_local;
  int *pVars_local;
  int nStrs_local;
  int nVars_local;
  sat_solver *pSat_local;
  
  k = nVars + nStrs;
  m = nVars;
  _VarPar = pStr0;
  do {
    if (pStr0 + nStrs <= _VarPar) {
      return 1;
    }
    if (_VarPar->fLut == 0) {
      if (10 < _VarPar->nVarIns) {
        __assert_fail("pStr->nVarIns <= SBD_DIV_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                      ,0x54,"int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)")
        ;
      }
      for (status = 0; status < _VarPar->nVarIns; status = status + 1) {
        for (pLits[5] = 0; pLits[5] < 2; pLits[5] = pLits[5] + 1) {
          local_68 = Abc_Var2Lit(pVars[k],1);
          nMints = Abc_Var2Lit(pVars[m],pLits[5]);
          pLits[0] = Abc_Var2Lit(pVars[_VarPar->VarIns[status]],(uint)((pLits[5] != 0 ^ 0xffU) & 1))
          ;
          pLits[4] = sat_solver_addclause(pSat,&local_68,pLits + 1);
          if (pLits[4] == 0) {
            return 0;
          }
        }
        k = k + 1;
      }
    }
    else {
      iVar1 = _VarPar->nVarIns;
      if (6 < _VarPar->nVarIns) {
        __assert_fail("pStr->nVarIns <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                      ,0x43,"int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)")
        ;
      }
      for (n = 0; n < 1 << ((byte)iVar1 & 0x1f); n = n + 1) {
        for (status = 0; status < _VarPar->nVarIns; status = status + 1) {
          iVar2 = Abc_Var2Lit(pVars[_VarPar->VarIns[status]],n >> ((byte)status & 0x1f) & 1);
          (&local_68)[status] = iVar2;
        }
        for (pLits[5] = 0; pLits[5] < 2; pLits[5] = pLits[5] + 1) {
          iVar2 = Abc_Var2Lit(pVars[k],pLits[5]);
          (&local_68)[_VarPar->nVarIns] = iVar2;
          iVar2 = Abc_Var2Lit(pVars[m],(uint)((pLits[5] != 0 ^ 0xffU) & 1));
          (&local_68)[_VarPar->nVarIns + 1] = iVar2;
          pLits[4] = sat_solver_addclause(pSat,&local_68,pLits + _VarPar->nVarIns);
          if (pLits[4] == 0) {
            return 0;
          }
        }
        k = k + 1;
      }
    }
    _VarPar = _VarPar + 1;
    m = m + 1;
  } while( true );
}

Assistant:

int Sbd_ProblemAddClauses( sat_solver * pSat, int nVars, int nStrs, int * pVars, Sbd_Str_t * pStr0 )
{   
    // variable order:  inputs, structure outputs, parameters
    Sbd_Str_t * pStr;
    int VarOut = nVars;
    int VarPar = nVars + nStrs;
    int m, k, n, status, pLits[SBD_SIZE_MAX+2];
//printf( "Start par = %d.  ", VarPar );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++, VarOut++ )
    {
        if ( pStr->fLut )
        {
            int nMints = 1 << pStr->nVarIns;
            assert( pStr->nVarIns <= 6 );
            for ( m = 0; m < nMints; m++, VarPar++ )
            {
                for ( k = 0; k < pStr->nVarIns; k++ )
                    pLits[k] = Abc_Var2Lit( pVars[pStr->VarIns[k]], (m >> k) & 1 ); 
                for ( n = 0; n < 2; n++ )
                {
                    pLits[pStr->nVarIns]   = Abc_Var2Lit( pVars[VarPar], n );
                    pLits[pStr->nVarIns+1] = Abc_Var2Lit( pVars[VarOut], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + pStr->nVarIns + 2 );
                    if ( !status )
                        return 0;
                }
            }
        }
        else
        {
            assert( pStr->nVarIns <= SBD_DIV_MAX );
            for ( k = 0; k < pStr->nVarIns; k++, VarPar++ )
            {
                for ( n = 0; n < 2; n++ )
                {
                    pLits[0] = Abc_Var2Lit( pVars[VarPar], 1 );
                    pLits[1] = Abc_Var2Lit( pVars[VarOut], n );
                    pLits[2] = Abc_Var2Lit( pVars[pStr->VarIns[k]], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + 3 );
                    if ( !status )
                        return 0;
                }
            }
        }
    }
    return 1;
}